

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O3

int __thiscall piksel::Font::_load(Font *this,uchar *fontBuffer)

{
  pointer *ppLVar1;
  iterator __position;
  Point2 p0;
  Point2 p0_00;
  Point2 p0_01;
  Point2 p1;
  Point2 p1_00;
  Point2 p1_01;
  Point2 p2;
  Point2 p2_00;
  Point2 p3;
  stbtt_vertex *psVar2;
  Shape SVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  stbtt_fontinfo *psVar7;
  Font *pFVar8;
  long lVar9;
  Letter letter;
  EdgeHolder edge;
  stbtt_vertex *vertices;
  Shape shape;
  undefined1 local_108 [12];
  int iStack_fc;
  undefined8 local_f8;
  int iStack_f0;
  int iStack_ec;
  Contour local_e8;
  Font *local_d0;
  EdgeHolder local_c8;
  uint local_c0;
  int local_bc;
  Vector2 local_b8;
  Shape local_a8;
  pointer pEStack_a0;
  Shape local_98;
  pointer pEStack_90;
  Shape local_88;
  pointer pEStack_80;
  vector<piksel::Letter,std::allocator<piksel::Letter>> *local_78;
  stbtt_vertex *local_70;
  vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> local_68;
  Shape local_50;
  
  psVar7 = (stbtt_fontinfo *)operator_new(0xa0);
  iVar6 = 0;
  memset(psVar7,0,0xa0);
  this->info = psVar7;
  iVar4 = stbtt_InitFont(psVar7,fontBuffer,0);
  if (iVar4 == 0) {
    _load();
  }
  else {
    stbtt_GetFontVMetrics(this->info,&this->ascent,&this->descent,&this->lineGap);
    stbtt_GetFontBoundingBox(this->info,&this->x0,&this->y1,&this->x1,&this->y1);
    local_78 = (vector<piksel::Letter,std::allocator<piksel::Letter>> *)&this->letters;
    local_bc = 0x20;
    local_d0 = this;
    do {
      psVar7 = local_d0->info;
      iVar4 = stbtt_FindGlyphIndex(psVar7,local_bc);
      uVar5 = stbtt_GetGlyphShape(psVar7,iVar4,&local_70);
      msdfgen::Shape::Shape(&local_50);
      local_e8.edges.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.edges.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.edges.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      msdfgen::EdgeHolder::EdgeHolder(&local_c8);
      pFVar8 = local_d0;
      lVar9 = 0;
      do {
        msdfgen::Vector2::Vector2((Vector2 *)((long)&local_b8.x + lVar9),0.0);
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x40);
      if (0 < (int)uVar5) {
        lVar9 = 0;
        local_c0 = uVar5;
        SVar3 = (Shape)local_b8.x;
        do {
          local_b8.x = (double)SVar3;
          psVar2 = local_70;
          switch((&local_70->type)[lVar9]) {
          case '\x01':
            if (lVar9 != 0) {
              msdfgen::Shape::addContour(&local_50,&local_e8);
              local_f8 = local_e8.edges.
                         super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              unique0x10000f4f =
                   local_e8.edges.
                   super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              local_108._0_8_ =
                   local_e8.edges.
                   super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_e8.edges.
              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.edges.
              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.edges.
              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_68.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_68.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_68.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::~vector
                        ((vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> *)
                         local_108);
              std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::~vector
                        (&local_68);
            }
            break;
          case '\x02':
            msdfgen::Vector2::Vector2
                      ((Vector2 *)local_108,(double)(int)*(short *)((long)&local_70->x + lVar9),
                       (double)(int)*(short *)((long)&local_70->y + lVar9));
            local_a8.xoff = local_108._0_4_;
            local_a8.yoff = local_108._4_4_;
            pEStack_a0 = stack0xffffffffffffff00;
            p0_01.y = local_b8.y;
            p0_01.x = local_b8.x;
            p1_01.y = (double)stack0xffffffffffffff00;
            p1_01.x = (double)local_108._0_8_;
            msdfgen::EdgeHolder::EdgeHolder((EdgeHolder *)local_108,p0_01,p1_01,WHITE);
            msdfgen::Contour::addEdge(&local_e8,(EdgeHolder *)local_108);
            goto LAB_0014b94f;
          case '\x03':
            msdfgen::Vector2::Vector2
                      ((Vector2 *)local_108,(double)(int)*(short *)((long)&local_70->cx + lVar9),
                       (double)(int)*(short *)((long)&local_70->cy + lVar9));
            local_a8.xoff = local_108._0_4_;
            local_a8.yoff = local_108._4_4_;
            pEStack_a0 = stack0xffffffffffffff00;
            msdfgen::Vector2::Vector2
                      ((Vector2 *)local_108,(double)(int)*(short *)((long)&psVar2->x + lVar9),
                       (double)(int)*(short *)((long)&psVar2->y + lVar9));
            local_98.xoff = local_108._0_4_;
            local_98.yoff = local_108._4_4_;
            pEStack_90 = stack0xffffffffffffff00;
            p0.y = local_b8.y;
            p0.x = local_b8.x;
            p1.y = (double)pEStack_a0;
            p1.x = (double)local_a8;
            p2.y = (double)stack0xffffffffffffff00;
            p2.x = (double)local_108._0_8_;
            msdfgen::EdgeHolder::EdgeHolder((EdgeHolder *)local_108,p0,p1,p2,WHITE);
            msdfgen::Contour::addEdge(&local_e8,(EdgeHolder *)local_108);
LAB_0014b94f:
            msdfgen::EdgeHolder::~EdgeHolder((EdgeHolder *)local_108);
            break;
          case '\x04':
            msdfgen::Vector2::Vector2
                      ((Vector2 *)local_108,(double)(int)*(short *)((long)&local_70->cx + lVar9),
                       (double)(int)*(short *)((long)&local_70->cy + lVar9));
            local_a8.xoff = local_108._0_4_;
            local_a8.yoff = local_108._4_4_;
            pEStack_a0 = stack0xffffffffffffff00;
            msdfgen::Vector2::Vector2
                      ((Vector2 *)local_108,(double)(int)*(short *)((long)&psVar2->cx1 + lVar9),
                       (double)(int)*(short *)((long)&psVar2->cy1 + lVar9));
            local_98.xoff = local_108._0_4_;
            local_98.yoff = local_108._4_4_;
            pEStack_90 = stack0xffffffffffffff00;
            msdfgen::Vector2::Vector2
                      ((Vector2 *)local_108,(double)(int)*(short *)((long)&psVar2->x + lVar9),
                       (double)(int)*(short *)((long)&psVar2->y + lVar9));
            local_88.xoff = local_108._0_4_;
            local_88.yoff = local_108._4_4_;
            pEStack_80 = stack0xffffffffffffff00;
            p0_00.y = local_b8.y;
            p0_00.x = local_b8.x;
            p1_00.y = (double)pEStack_a0;
            p1_00.x = (double)local_a8;
            p2_00.y = (double)pEStack_90;
            p2_00.x = (double)local_98;
            p3.y = (double)stack0xffffffffffffff00;
            p3.x = (double)local_108._0_8_;
            msdfgen::EdgeHolder::EdgeHolder((EdgeHolder *)local_108,p0_00,p1_00,p2_00,p3,WHITE);
            msdfgen::EdgeHolder::operator=(&local_c8,(EdgeHolder *)local_108);
            msdfgen::EdgeHolder::~EdgeHolder((EdgeHolder *)local_108);
            msdfgen::Contour::addEdge(&local_e8,&local_c8);
          }
          msdfgen::Vector2::Vector2
                    ((Vector2 *)local_108,(double)(int)*(short *)((long)&psVar2->x + lVar9),
                     (double)(int)*(short *)((long)&psVar2->y + lVar9));
          pFVar8 = local_d0;
          SVar3.xoff = local_108._0_4_;
          SVar3.yoff = local_108._4_4_;
          local_b8.y = (double)stack0xffffffffffffff00;
          local_b8.x = (double)local_108._0_8_;
          lVar9 = lVar9 + 0xe;
        } while ((ulong)uVar5 * 0xe != lVar9);
        if (0 < (int)local_c0) {
          msdfgen::Shape::addContour(&local_50,&local_e8);
        }
      }
      registerShape(&local_50,(Shape *)local_108);
      iVar4 = local_bc;
      psVar7 = pFVar8->info;
      iVar6 = stbtt_FindGlyphIndex(psVar7,local_bc);
      stbtt_GetGlyphHMetrics(psVar7,iVar6,(int *)(local_108 + 8),&iStack_fc);
      psVar7 = pFVar8->info;
      iVar6 = stbtt_FindGlyphIndex(psVar7,iVar4);
      stbtt_GetGlyphBox(psVar7,iVar6,(int *)&local_f8,(int *)((long)&local_f8 + 4),&iStack_f0,
                        &iStack_ec);
      __position._M_current =
           (pFVar8->letters).super__Vector_base<piksel::Letter,_std::allocator<piksel::Letter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pFVar8->letters).super__Vector_base<piksel::Letter,_std::allocator<piksel::Letter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<piksel::Letter,std::allocator<piksel::Letter>>::
        _M_realloc_insert<piksel::Letter_const&>(local_78,__position,(Letter *)local_108);
      }
      else {
        (__position._M_current)->x0 = (int)local_f8;
        (__position._M_current)->y0 = (int)((ulong)local_f8 >> 0x20);
        (__position._M_current)->x1 = iStack_f0;
        (__position._M_current)->y1 = iStack_ec;
        ((__position._M_current)->shape).xoff = local_108._0_4_;
        ((__position._M_current)->shape).yoff = local_108._4_4_;
        *(pointer *)&(__position._M_current)->advanceWidth = stack0xffffffffffffff00;
        ppLVar1 = &(pFVar8->letters).
                   super__Vector_base<piksel::Letter,_std::allocator<piksel::Letter>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      msdfgen::EdgeHolder::~EdgeHolder(&local_c8);
      std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::~vector
                (&local_e8.edges);
      std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::~vector(&local_50.contours);
      local_bc = iVar4 + 1;
    } while (local_bc != 0x7f);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int Font::_load(const unsigned char* fontBuffer) {
    info = new stbtt_fontinfo();
    if (!stbtt_InitFont(info, fontBuffer, 0)) {
        fputs("Failed to load font", stderr);
        return 0;
    }
    stbtt_GetFontVMetrics(info, &ascent, &descent, &lineGap);
    stbtt_GetFontBoundingBox(info, &x0, &y1, &x1, &y1);

    for (char ch = ' '; ch <= '~'; ch++) {
        stbtt_vertex* vertices;
        int num_verts = stbtt_GetGlyphShape(info, stbtt_FindGlyphIndex(info, ch), &vertices);
        
        msdfgen::Shape shape;
        msdfgen::Contour contour;
        msdfgen::EdgeHolder edge;
        msdfgen::Point2 p[4];
        for (int i = 0; i < num_verts; i++) {
            stbtt_vertex* vertex = vertices + i;
            switch(vertex->type) {
                case STBTT_vmove:
                    if (i > 0) {
                        shape.addContour(contour);
                        contour = msdfgen::Contour();
                    }
                    break;
                case STBTT_vline:
                    p[1] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    contour.addEdge(msdfgen::EdgeHolder(p[0], p[1]));
                    break;
                case STBTT_vcurve:
                    p[1] = msdfgen::Point2((double) vertex->cx, (double) vertex->cy);
                    p[2] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    contour.addEdge(msdfgen::EdgeHolder(p[0], p[1], p[2]));
                    break;
                case STBTT_vcubic:
                    p[1] = msdfgen::Point2((double) vertex->cx, (double) vertex->cy);
                    p[2] = msdfgen::Point2((double) vertex->cx1, (double) vertex->cy1);
                    p[3] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    edge = msdfgen::EdgeHolder(p[0], p[1], p[2], p[3]);
                    contour.addEdge(edge);
                    break;
            }
            p[0] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
        }
        if (num_verts > 0) {
            shape.addContour(contour);
        }

        Letter letter;
        registerShape(shape, letter.shape);

        stbtt_GetGlyphHMetrics(info, stbtt_FindGlyphIndex(info, ch), &letter.advanceWidth, &letter.leftSideBearing);
        stbtt_GetGlyphBox(info, stbtt_FindGlyphIndex(info, ch), &letter.x0, &letter.y0, &letter.x1, &letter.y1);

        letters.push_back(letter);
    }

    return 1;
}